

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O0

int TIFFCheckTile(TIFF *tif,uint32_t x,uint32_t y,uint32_t z,uint16_t s)

{
  TIFFDirectory *td;
  uint16_t s_local;
  uint32_t z_local;
  uint32_t y_local;
  uint32_t x_local;
  TIFF *tif_local;
  
  if (x < (tif->tif_dir).td_imagewidth) {
    if (y < (tif->tif_dir).td_imagelength) {
      if (z < (tif->tif_dir).td_imagedepth) {
        if (((tif->tif_dir).td_planarconfig == 2) && ((tif->tif_dir).td_samplesperpixel <= s)) {
          TIFFErrorExtR(tif,tif->tif_name,"%lu: Sample out of range, max %lu",(ulong)s,
                        (long)(int)((tif->tif_dir).td_samplesperpixel - 1));
          tif_local._4_4_ = 0;
        }
        else {
          tif_local._4_4_ = 1;
        }
      }
      else {
        TIFFErrorExtR(tif,tif->tif_name,"%lu: Depth out of range, max %lu",(ulong)z,
                      (ulong)((tif->tif_dir).td_imagedepth - 1));
        tif_local._4_4_ = 0;
      }
    }
    else {
      TIFFErrorExtR(tif,tif->tif_name,"%lu: Row out of range, max %lu",(ulong)y,
                    (ulong)((tif->tif_dir).td_imagelength - 1));
      tif_local._4_4_ = 0;
    }
  }
  else {
    TIFFErrorExtR(tif,tif->tif_name,"%lu: Col out of range, max %lu",(ulong)x,
                  (ulong)((tif->tif_dir).td_imagewidth - 1));
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFCheckTile(TIFF *tif, uint32_t x, uint32_t y, uint32_t z, uint16_t s)
{
    TIFFDirectory *td = &tif->tif_dir;

    if (x >= td->td_imagewidth)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Col out of range, max %lu",
                      (unsigned long)x, (unsigned long)(td->td_imagewidth - 1));
        return (0);
    }
    if (y >= td->td_imagelength)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Row out of range, max %lu",
                      (unsigned long)y,
                      (unsigned long)(td->td_imagelength - 1));
        return (0);
    }
    if (z >= td->td_imagedepth)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Depth out of range, max %lu",
                      (unsigned long)z, (unsigned long)(td->td_imagedepth - 1));
        return (0);
    }
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE &&
        s >= td->td_samplesperpixel)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Sample out of range, max %lu",
                      (unsigned long)s,
                      (unsigned long)(td->td_samplesperpixel - 1));
        return (0);
    }
    return (1);
}